

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O1

DdNode * UAbuildSubset(DdManager *dd,DdNode *node,ApproxInfo *info)

{
  int *piVar1;
  int iVar2;
  DdNode *T;
  DdNode *T_00;
  DdNode *pDVar3;
  DdNode *pDVar4;
  ulong uVar5;
  DdNode *key;
  NodeData *infoN;
  char *local_38;
  
  key = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  if (key->index == 0x7fffffff) {
    return node;
  }
  iVar2 = st__lookup(info->table,(char *)key,&local_38);
  if (iVar2 == 0) {
    fwrite("Something is wrong, ought to be in info table\n",0x2e,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INTERNAL_ERROR;
  }
  else {
    if (local_38[0x15] == '\x01') {
      return info->zero;
    }
    if (key == node) {
      pDVar3 = *(DdNode **)(local_38 + 0x18);
    }
    else {
      pDVar3 = *(DdNode **)(local_38 + 0x20);
    }
    if (pDVar3 != (DdNode *)0x0) {
      return pDVar3;
    }
    uVar5 = (ulong)((uint)node & 1);
    pDVar3 = (key->type).kids.E;
    T = UAbuildSubset(dd,(DdNode *)((ulong)(key->type).kids.T ^ uVar5),info);
    if (T != (DdNode *)0x0) {
      T_00 = (DdNode *)((ulong)T & 0xfffffffffffffffe);
      T_00->ref = T_00->ref + 1;
      pDVar3 = UAbuildSubset(dd,(DdNode *)(uVar5 ^ (ulong)pDVar3),info);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        if (((ulong)T & 1) == 0) {
          pDVar4 = T;
          if (T != pDVar3) {
            pDVar4 = cuddUniqueInter(dd,key->index,T,pDVar3);
          }
          T_00 = T;
          if (pDVar4 != (DdNode *)0x0) {
LAB_0076f2a7:
            piVar1 = (int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            if (key != node) {
              *(DdNode **)(local_38 + 0x20) = pDVar4;
              return pDVar4;
            }
            *(DdNode **)(local_38 + 0x18) = pDVar4;
            return pDVar4;
          }
        }
        else {
          pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
          pDVar4 = T_00;
          if (T_00 != pDVar3) {
            pDVar4 = cuddUniqueInter(dd,key->index,T_00,pDVar3);
          }
          T = T_00;
          if (pDVar4 != (DdNode *)0x0) {
            pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
            goto LAB_0076f2a7;
          }
        }
        Cudd_RecursiveDeref(dd,pDVar3);
      }
      Cudd_RecursiveDeref(dd,T);
    }
  }
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
UAbuildSubset(
  DdManager * dd /* DD manager */,
  DdNode * node /* current node */,
  ApproxInfo * info /* node info */)
{

    DdNode *Nt, *Ne, *N, *t, *e, *r;
    NodeData *infoN;

    if (Cudd_IsConstant(node))
        return(node);

    N = Cudd_Regular(node);

    if ( st__lookup(info->table, (const char *)N, (char **)&infoN)) {
        if (infoN->replace == TRUE) {
            return(info->zero);
        }
        if (N == node ) {
            if (infoN->resultP != NULL) {
                return(infoN->resultP);
            }
        } else {
            if (infoN->resultN != NULL) {
                return(infoN->resultN);
            }
        }
    } else {
        (void) fprintf(dd->err,
                       "Something is wrong, ought to be in info table\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return(NULL);
    }

    Nt = Cudd_NotCond(cuddT(N), Cudd_IsComplement(node));
    Ne = Cudd_NotCond(cuddE(N), Cudd_IsComplement(node));

    t = UAbuildSubset(dd, Nt, info);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);

    e = UAbuildSubset(dd, Ne, info);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd,t);
        return(NULL);
    }
    cuddRef(e);

    if (Cudd_IsComplement(t)) {
        t = Cudd_Not(t);
        e = Cudd_Not(e);
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
        r = Cudd_Not(r);
    } else {
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
    }
    cuddDeref(t);
    cuddDeref(e);

    if (N == node) {
        infoN->resultP = r;
    } else {
        infoN->resultN = r;
    }

    return(r);

}